

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall SQCompilation::SQParser::LogicalOrExp(SQParser *this)

{
  BinExpr *args_1;
  Expr *args_2;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  args_1 = (BinExpr *)LogicalAndExp(this);
  while( true ) {
    NestingChecker::inc(&nc);
    if (this->_token != 0x10f) break;
    Lex(this);
    args_2 = LogicalOrExp(this);
    args_1 = newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                       (this,TO_OROR,&args_1->super_Expr,args_2);
  }
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return &args_1->super_Expr;
}

Assistant:

Expr* SQParser::LogicalOrExp()
{
    NestingChecker nc(this);
    Expr *lhs = LogicalAndExp();
    for (;;) {
        nc.inc();
        if (_token == TK_OR) {
            Lex();

            Expr *rhs = LogicalOrExp();
            lhs = newNode<BinExpr>(TO_OROR, lhs, rhs);
        }
        else return lhs;
    }
}